

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt1.cpp
# Opt level: O0

bool __thiscall
crnlib::dxt1_endpoint_optimizer::evaluate_solution_hc_perceptual
          (dxt1_endpoint_optimizer *this,dxt1_solution_coordinates *coords,bool alternate_rounding)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint b;
  uint e23;
  uint e01;
  uint count;
  unique_color *color;
  uint64 error;
  color_quad<unsigned_char,_int> local_30;
  color_quad_u8 c3;
  color_quad_u8 c2;
  color_quad_u8 c1;
  color_quad_u8 c0;
  bool alternate_rounding_local;
  dxt1_solution_coordinates *coords_local;
  dxt1_endpoint_optimizer *this_local;
  
  dxt1_block::unpack_color((dxt1_block *)&c2,coords->m_low_color,true,0xff);
  dxt1_block::unpack_color((dxt1_block *)&c3,coords->m_high_color,true,0xff);
  color_quad<unsigned_char,_int>::color_quad
            (&local_30,
             ((uint)c2.field_0.field_0.r * 2 + (uint)c3.field_0.field_0.r + (uint)alternate_rounding
             ) / 3,((uint)c2.field_0.field_0.g * 2 + (uint)c3.field_0.field_0.g +
                   (uint)alternate_rounding) / 3,
             ((uint)c2.field_0.field_0.b * 2 + (uint)c3.field_0.field_0.b + (uint)alternate_rounding
             ) / 3,0);
  color_quad<unsigned_char,_int>::color_quad
            ((color_quad<unsigned_char,_int> *)((long)&error + 4),
             ((uint)c3.field_0.field_0.r * 2 + (uint)c2.field_0.field_0.r + (uint)alternate_rounding
             ) / 3,((uint)c3.field_0.field_0.g * 2 + (uint)c2.field_0.field_0.g +
                   (uint)alternate_rounding) / 3,
             ((uint)c3.field_0.field_0.b * 2 + (uint)c2.field_0.field_0.b + (uint)alternate_rounding
             ) / 3,0);
  color = (unique_color *)0x0;
  _e01 = vector<crnlib::unique_color>::get_ptr(&this->m_evaluated_colors);
  e23 = vector<crnlib::unique_color>::size(&this->m_evaluated_colors);
  while (e23 != 0) {
    uVar1 = crnlib::color::color_distance(true,&_e01->m_color,&c2,false);
    uVar2 = crnlib::color::color_distance(true,&_e01->m_color,&c3,false);
    uVar3 = math::minimum<unsigned_int>(uVar1,uVar2);
    uVar1 = crnlib::color::color_distance(true,&_e01->m_color,&local_30,false);
    uVar2 = crnlib::color::color_distance
                      (true,&_e01->m_color,(color_quad_u8 *)((long)&error + 4),false);
    b = math::minimum<unsigned_int>(uVar1,uVar2);
    uVar3 = math::minimum<unsigned_int>(uVar3,b);
    color = (unique_color *)((color->m_color).field_0.c + (ulong)uVar3 * (ulong)_e01->m_weight);
    _e01 = _e01 + 1;
    if (color < (unique_color *)(this->m_best_solution).m_error) {
      e23 = e23 - 1;
    }
    else {
      e23 = 0;
    }
  }
  if (color < (unique_color *)(this->m_best_solution).m_error) {
    (this->m_best_solution).m_coords = *coords;
    (this->m_best_solution).m_error = (uint64)color;
    (this->m_best_solution).m_alpha_block = false;
    (this->m_best_solution).m_alternate_rounding = alternate_rounding;
    (this->m_best_solution).m_enforce_selector =
         (this->m_best_solution).m_coords.m_low_color ==
         (this->m_best_solution).m_coords.m_high_color;
    if (((this->m_best_solution).m_enforce_selector & 1U) != 0) {
      if (((this->m_best_solution).m_coords.m_low_color & 0x1f) == 0x1f) {
        (this->m_best_solution).m_coords.m_high_color =
             (this->m_best_solution).m_coords.m_high_color - 1;
        (this->m_best_solution).m_enforced_selector = '\0';
      }
      else {
        (this->m_best_solution).m_coords.m_low_color =
             (this->m_best_solution).m_coords.m_low_color + 1;
        (this->m_best_solution).m_enforced_selector = '\x01';
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool dxt1_endpoint_optimizer::evaluate_solution_hc_perceptual(const dxt1_solution_coordinates& coords, bool alternate_rounding)
    {
        color_quad_u8 c0 = dxt1_block::unpack_color(coords.m_low_color, true);
        color_quad_u8 c1 = dxt1_block::unpack_color(coords.m_high_color, true);
        color_quad_u8 c2((c0.r * 2 + c1.r + alternate_rounding) / 3, (c0.g * 2 + c1.g + alternate_rounding) / 3, (c0.b * 2 + c1.b + alternate_rounding) / 3, 0);
        color_quad_u8 c3((c1.r * 2 + c0.r + alternate_rounding) / 3, (c1.g * 2 + c0.g + alternate_rounding) / 3, (c1.b * 2 + c0.b + alternate_rounding) / 3, 0);
        uint64 error = 0;
        unique_color* color = m_evaluated_colors.get_ptr();
        for (uint count = m_evaluated_colors.size(); count; color++, error < m_best_solution.m_error ? count-- : count = 0)
        {
            uint e01 = math::minimum(color::color_distance(true, color->m_color, c0, false), color::color_distance(true, color->m_color, c1, false));
            uint e23 = math::minimum(color::color_distance(true, color->m_color, c2, false), color::color_distance(true, color->m_color, c3, false));
            error += math::minimum(e01, e23) * (uint64)color->m_weight;
        }
        if (error >= m_best_solution.m_error)
        {
            return false;
        }
        m_best_solution.m_coords = coords;
        m_best_solution.m_error = error;
        m_best_solution.m_alpha_block = false;
        m_best_solution.m_alternate_rounding = alternate_rounding;
        m_best_solution.m_enforce_selector = m_best_solution.m_coords.m_low_color == m_best_solution.m_coords.m_high_color;
        if (m_best_solution.m_enforce_selector)
        {
            if ((m_best_solution.m_coords.m_low_color & 31) != 31)
            {
                m_best_solution.m_coords.m_low_color++;
                m_best_solution.m_enforced_selector = 1;
            }
            else
            {
                m_best_solution.m_coords.m_high_color--;
                m_best_solution.m_enforced_selector = 0;
            }
        }
        return true;
    }